

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelNodeHashMap_StandardLayout_Test::
~ParallelNodeHashMap_StandardLayout_Test(ParallelNodeHashMap_StandardLayout_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, StandardLayout) {
  struct Int {
    explicit Int(size_t val) : value(val) {}
    Int() : value(0) { ADD_FAILURE(); }
    Int(const Int& other) : value(other.value) { ADD_FAILURE(); }
    Int(Int&&) = default;
    bool operator==(const Int& other) const { return value == other.value; }
    size_t value;
  };
  static_assert(std::is_standard_layout<Int>(), "");

  struct Hash {
    size_t operator()(const Int& obj) const { return obj.value; }
  };

  // Verify that neither the key nor the value get default-constructed or
  // copy-constructed.
  {
    ThisMap<Int, Int, Hash> m;
    m.try_emplace(Int(1), Int(2));
    m.try_emplace(Int(3), Int(4));
    m.erase(Int(1));
    m.rehash(2 * m.bucket_count());
  }
  {
    ThisMap<Int, Int, Hash> m;
    m.try_emplace(Int(1), Int(2));
    m.try_emplace(Int(3), Int(4));
    m.erase(Int(1));
    m.clear();
  }
}